

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall
deqp::gls::anon_unknown_1::DrawTestShaderProgram::shadeVertices
          (DrawTestShaderProgram *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  value_type vVar5;
  VertexPacket *pVVar6;
  int iVar7;
  UniformSlot *pUVar8;
  size_type sVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  float *pfVar12;
  Vector<float,_4> local_e0;
  Vector<float,_4> local_d0;
  Vector<float,_4> local_c0;
  Vector<float,_4> local_b0;
  Vector<float,_4> local_a0;
  Vector<unsigned_int,_4> local_90;
  Vector<int,_4> local_80;
  Vector<float,_4> local_70;
  byte local_5d;
  value_type local_5c;
  int iStack_58;
  bool isCoord;
  int numComponents;
  int attribNdx;
  Vec3 color;
  Vec2 coord;
  VertexPacket *packet;
  size_t varyingLocColor;
  int packetNdx;
  float u_colorScale;
  float u_coordScale;
  int numPackets_local;
  VertexPacket **packets_local;
  VertexAttrib *inputs_local;
  DrawTestShaderProgram *this_local;
  
  pUVar8 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_coordScale");
  fVar1 = (pUVar8->value).f;
  pUVar8 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_colorScale");
  fVar2 = (pUVar8->value).f;
  for (varyingLocColor._0_4_ = 0; (int)varyingLocColor < numPackets;
      varyingLocColor._0_4_ = (int)varyingLocColor + 1) {
    pVVar6 = packets[(int)varyingLocColor];
    tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(color.m_data + 1),0.0,0.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&numComponents,1.0,1.0,1.0);
    for (iStack_58 = 0; iVar7 = iStack_58,
        sVar9 = std::vector<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>::size
                          (&this->m_attrType), iVar7 < (int)sVar9; iStack_58 = iStack_58 + 1) {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&this->m_componentCount,(long)iStack_58);
      local_5c = *pvVar10;
      local_5d = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&this->m_isCoord,(long)iStack_58);
      pvVar11 = std::vector<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>::operator[]
                          (&this->m_attrType,(long)iStack_58);
      vVar5 = *pvVar11;
      if (vVar5 == GENERICVECTYPE_FLOAT) {
        rr::readVertexAttribFloat
                  ((rr *)&local_70,inputs + iStack_58,pVVar6->instanceNdx,pVVar6->vertexNdx);
        calcShaderColorCoord<float>
                  ((Vec2 *)(color.m_data + 1),(Vec3 *)&numComponents,&local_70,(bool)(local_5d & 1),
                   local_5c);
      }
      else if (vVar5 == GENERICVECTYPE_UINT32) {
        rr::readVertexAttribUint
                  ((rr *)&local_90,inputs + iStack_58,pVVar6->instanceNdx,pVVar6->vertexNdx);
        calcShaderColorCoord<unsigned_int>
                  ((Vec2 *)(color.m_data + 1),(Vec3 *)&numComponents,&local_90,(bool)(local_5d & 1),
                   local_5c);
      }
      else if (vVar5 == GENERICVECTYPE_INT32) {
        rr::readVertexAttribInt
                  ((rr *)&local_80,inputs + iStack_58,pVVar6->instanceNdx,pVVar6->vertexNdx);
        calcShaderColorCoord<int>
                  ((Vec2 *)(color.m_data + 1),(Vec3 *)&numComponents,&local_80,(bool)(local_5d & 1),
                   local_5c);
      }
    }
    pfVar12 = tcu::Vector<float,_2>::x((Vector<float,_2> *)(color.m_data + 1));
    fVar3 = *pfVar12;
    pfVar12 = tcu::Vector<float,_2>::y((Vector<float,_2> *)(color.m_data + 1));
    tcu::Vector<float,_4>::Vector(&local_a0,fVar1 * fVar3,fVar1 * *pfVar12,1.0,1.0);
    *(undefined8 *)(pVVar6->position).m_data = local_a0.m_data._0_8_;
    *(undefined8 *)((pVVar6->position).m_data + 2) = local_a0.m_data._8_8_;
    pVVar6->pointSize = 1.0;
    pfVar12 = tcu::Vector<float,_3>::x((Vector<float,_3> *)&numComponents);
    fVar3 = *pfVar12;
    pfVar12 = tcu::Vector<float,_3>::y((Vector<float,_3> *)&numComponents);
    fVar4 = *pfVar12;
    pfVar12 = tcu::Vector<float,_3>::z((Vector<float,_3> *)&numComponents);
    tcu::Vector<float,_4>::Vector(&local_d0,fVar2 * fVar3,fVar2 * fVar4,fVar2 * *pfVar12,1.0);
    tcu::operator*((tcu *)&local_c0,&local_d0,0.5);
    tcu::Vector<float,_4>::Vector(&local_e0,0.5,0.5,0.5,0.5);
    tcu::operator+((tcu *)&local_b0,&local_c0,&local_e0);
    rr::GenericVec4::operator=(pVVar6->outputs,&local_b0);
  }
  return;
}

Assistant:

void DrawTestShaderProgram::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	const float	u_coordScale = getUniformByName("u_coordScale").value.f;
	const float u_colorScale = getUniformByName("u_colorScale").value.f;

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const size_t varyingLocColor = 0;

		rr::VertexPacket& packet = *packets[packetNdx];

		// Calc output color
		tcu::Vec2 coord = tcu::Vec2(0.0, 0.0);
		tcu::Vec3 color = tcu::Vec3(1.0, 1.0, 1.0);

		for (int attribNdx = 0; attribNdx < (int)m_attrType.size(); attribNdx++)
		{
			const int	numComponents	= m_componentCount[attribNdx];
			const bool	isCoord			= m_isCoord[attribNdx];

			switch (m_attrType[attribNdx])
			{
				case rr::GENERICVECTYPE_FLOAT:	calcShaderColorCoord(coord, color, rr::readVertexAttribFloat(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), isCoord, numComponents);	break;
				case rr::GENERICVECTYPE_INT32:	calcShaderColorCoord(coord, color, rr::readVertexAttribInt	(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), isCoord, numComponents);	break;
				case rr::GENERICVECTYPE_UINT32:	calcShaderColorCoord(coord, color, rr::readVertexAttribUint	(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), isCoord, numComponents);	break;
				default:
					DE_ASSERT(false);
			}
		}

		// Transform position
		{
			packet.position = tcu::Vec4(u_coordScale * coord.x(), u_coordScale * coord.y(), 1.0f, 1.0f);
			packet.pointSize = 1.0f;
		}

		// Pass color to FS
		{
			packet.outputs[varyingLocColor] = tcu::Vec4(u_colorScale * color.x(), u_colorScale * color.y(), u_colorScale * color.z(), 1.0f) * 0.5f + tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f);
		}
	}
}